

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.h
# Opt level: O2

void kj::
     ctor<kj::_::SimpleTransformPromiseNode<void,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0>,kj::Own<kj::_::PromiseNode,kj::_::PromiseDisposer>,capnp::_::TestMoreStuffImpl::callFooWhenResolved(capnp::CallContext<capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedParams,capnproto_test::capnp::test::TestMoreStuff::CallFooWhenResolvedResults>)::__0,void*&>
               (SimpleTransformPromiseNode<void,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_capnp_test_util_c__:1079:34)>
                *location,Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *params,
               anon_class_32_2_dc087ca5_for_func *params_1,void **params_2)

{
  _func_int *p_Var1;
  _func_int *p_Var2;
  undefined8 uVar3;
  
  _::TransformPromiseNodeBase::TransformPromiseNodeBase
            (&location->super_TransformPromiseNodeBase,params,*params_2);
  (location->super_TransformPromiseNodeBase).super_PromiseNode.super_PromiseArenaMember.
  _vptr_PromiseArenaMember = (_func_int **)&PTR_destroy_006546c0;
  p_Var2 = (params_1->cap)._vptr_Client[-3];
  p_Var1 = (_func_int *)((long)&(params_1->cap)._vptr_Client + (long)p_Var2);
  uVar3 = *(undefined8 *)(p_Var1 + 8);
  *(undefined8 *)&(location->func).cap.field_0x8 = *(undefined8 *)p_Var1;
  *(undefined8 *)&(location->func).cap.field_0x10 = uVar3;
  *(undefined8 *)(&(params_1->cap).field_0x8 + (long)p_Var2) = 0;
  (location->func).cap._vptr_Client = (_func_int **)&capnp::Capability::Client::typeinfo;
  (location->func).context.hook = (params_1->context).hook;
  return;
}

Assistant:

inline void ctor(T& location, Params&&... params) {
  new (_::PlacementNew(), &location) T(kj::fwd<Params>(params)...);
}